

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_SetVolume(FACTWave *pWave,float volume)

{
  long in_RDI;
  float in_XMM0_Da;
  uint32_t in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float fVar1;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x11657b);
    if (in_XMM0_Da <= 16777216.0) {
      in_stack_ffffffffffffffe4 = in_XMM0_Da;
      fVar1 = in_XMM0_Da;
      if (in_XMM0_Da < 0.0) {
        in_stack_ffffffffffffffe4 = 0.0;
        fVar1 = 0.0;
      }
    }
    else {
      fVar1 = 16777216.0;
    }
    *(float *)(in_RDI + 0x24) = fVar1;
    FAudioVoice_SetVolume
              ((FAudioVoice *)CONCAT44(in_XMM0_Da,fVar1),in_stack_ffffffffffffffe4,
               in_stack_ffffffffffffffe0);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x11660c);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWave_SetVolume(FACTWave *pWave, float volume)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	pWave->volume = FAudio_clamp(
		volume,
		FACTVOLUME_MIN,
		FACTVOLUME_MAX
	);
	FAudioVoice_SetVolume(
		pWave->voice,
		pWave->volume,
		0
	);
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}